

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall mjs::parser::check_string_literal(parser *this,source_extend *extend)

{
  bool bVar1;
  wchar_t *in_RDX;
  wchar_t *in_R9;
  wstring_view s;
  wstring_view message;
  wostringstream _oss;
  size_t local_1a8;
  source_extend *local_1a0;
  wostringstream local_188 [376];
  
  s._M_len = (((extend->file).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->text_)._M_dataplus._M_p + extend->start;
  s._M_str = in_RDX;
  bVar1 = has_octal_escape_sequence((mjs *)(ulong)(extend->end - extend->start),s);
  if (!bVar1) {
    return;
  }
  std::__cxx11::wostringstream::wostringstream(local_188);
  std::operator<<((wostream *)local_188,"Octal escape sequences may not be used in strict mode");
  std::__cxx11::wstringbuf::str();
  message._M_str = in_R9;
  message._M_len = local_1a8;
  syntax_error((parser *)"check_string_literal",(char *)0x1a1,(int)extend,local_1a0,message);
}

Assistant:

void check_string_literal(const source_extend& extend) {
        if (has_octal_escape_sequence(extend.source_view())) {
            SYNTAX_ERROR_AT("Octal escape sequences may not be used in strict mode", extend);
        }
    }